

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O0

void __thiscall
cmExportFileGenerator::GenerateImportPropertyCode
          (cmExportFileGenerator *this,ostream *os,string *config,cmGeneratorTarget *target,
          ImportPropertyMap *properties)

{
  bool bVar1;
  ostream *poVar2;
  ulong uVar3;
  pointer ppVar4;
  string local_d0;
  _Self local_b0;
  _Self local_a8;
  const_iterator pi;
  string local_70;
  string local_50 [8];
  string targetName;
  ImportPropertyMap *properties_local;
  cmGeneratorTarget *target_local;
  string *config_local;
  ostream *os_local;
  cmExportFileGenerator *this_local;
  
  targetName.field_2._8_8_ = properties;
  std::__cxx11::string::string(local_50,(string *)&this->Namespace);
  cmGeneratorTarget::GetExportName_abi_cxx11_(&local_70,target);
  std::__cxx11::string::operator+=(local_50,(string *)&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  poVar2 = std::operator<<(os,"# Import target \"");
  poVar2 = std::operator<<(poVar2,local_50);
  poVar2 = std::operator<<(poVar2,"\" for configuration \"");
  poVar2 = std::operator<<(poVar2,(string *)config);
  std::operator<<(poVar2,"\"\n");
  poVar2 = std::operator<<(os,"set_property(TARGET ");
  poVar2 = std::operator<<(poVar2,local_50);
  std::operator<<(poVar2," APPEND PROPERTY IMPORTED_CONFIGURATIONS ");
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    cmsys::SystemTools::UpperCase((string *)&pi,config);
    std::operator<<(os,(string *)&pi);
    std::__cxx11::string::~string((string *)&pi);
  }
  else {
    std::operator<<(os,"NOCONFIG");
  }
  std::operator<<(os,")\n");
  poVar2 = std::operator<<(os,"set_target_properties(");
  poVar2 = std::operator<<(poVar2,local_50);
  std::operator<<(poVar2," PROPERTIES\n");
  local_a8._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)targetName.field_2._8_8_);
  while( true ) {
    local_b0._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)targetName.field_2._8_8_);
    bVar1 = std::operator!=(&local_a8,&local_b0);
    if (!bVar1) break;
    poVar2 = std::operator<<(os,"  ");
    ppVar4 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_a8);
    poVar2 = std::operator<<(poVar2,(string *)ppVar4);
    poVar2 = std::operator<<(poVar2," ");
    ppVar4 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_a8);
    cmExportFileGeneratorEscape(&local_d0,&ppVar4->second);
    poVar2 = std::operator<<(poVar2,(string *)&local_d0);
    std::operator<<(poVar2,"\n");
    std::__cxx11::string::~string((string *)&local_d0);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator++(&local_a8);
  }
  poVar2 = std::operator<<(os,"  )\n");
  std::operator<<(poVar2,"\n");
  std::__cxx11::string::~string(local_50);
  return;
}

Assistant:

void cmExportFileGenerator::GenerateImportPropertyCode(
  std::ostream& os, const std::string& config, cmGeneratorTarget const* target,
  ImportPropertyMap const& properties)
{
  // Construct the imported target name.
  std::string targetName = this->Namespace;

  targetName += target->GetExportName();

  // Set the import properties.
  os << "# Import target \"" << targetName << "\" for configuration \""
     << config << "\"\n";
  os << "set_property(TARGET " << targetName
     << " APPEND PROPERTY IMPORTED_CONFIGURATIONS ";
  if (!config.empty()) {
    os << cmSystemTools::UpperCase(config);
  } else {
    os << "NOCONFIG";
  }
  os << ")\n";
  os << "set_target_properties(" << targetName << " PROPERTIES\n";
  for (ImportPropertyMap::const_iterator pi = properties.begin();
       pi != properties.end(); ++pi) {
    os << "  " << pi->first << " " << cmExportFileGeneratorEscape(pi->second)
       << "\n";
  }
  os << "  )\n"
     << "\n";
}